

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O1

void baryonyx::itm::
     init_with_pre_solve<baryonyx::itm::default_cost_type<float>,baryonyx::itm::minimize_tag>
               (bit_array *x_pessimistic,bit_array *x_optimistic,random_engine *rng,
               default_cost_type<float> *c,
               vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
               *constraints,double init_random)

{
  pointer pfVar1;
  float *pfVar2;
  size_type __n;
  pointer prVar3;
  pointer prVar4;
  merged_constraint *cst;
  int *piVar5;
  merged_constraint *cst_1;
  pointer pmVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
  *__range2;
  long lVar13;
  long lVar14;
  double dVar15;
  vector<reduced_cost,_std::allocator<reduced_cost>_> R;
  _Adaptor<std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>,_double>
  __aurng;
  allocator_type local_71;
  ulong local_70;
  vector<reduced_cost,_std::allocator<reduced_cost>_> local_68;
  random_engine *local_50;
  default_cost_type<float> *local_48;
  pointer local_40;
  double local_38;
  
  __n = 0;
  for (pmVar6 = (constraints->
                super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pmVar6 != (constraints->
                super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                )._M_impl.super__Vector_impl_data._M_finish; pmVar6 = pmVar6 + 1) {
    uVar7 = (ulong)((long)(pmVar6->elements).
                          super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pmVar6->elements).
                         super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 3;
    uVar8 = uVar7 & 0xffffffff;
    if ((int)uVar7 < (int)__n) {
      uVar8 = __n;
    }
    __n = uVar8;
  }
  local_50 = rng;
  local_48 = c;
  local_38 = init_random;
  std::vector<reduced_cost,_std::allocator<reduced_cost>_>::vector(&local_68,__n,&local_71);
  pmVar6 = (constraints->
           super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_40 = (constraints->
             super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  if (pmVar6 != local_40) {
    do {
      dVar15 = std::
               generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                         (local_50);
      if (dVar15 < local_38) {
        std::vector<reduced_cost,_std::allocator<reduced_cost>_>::resize
                  (&local_68,
                   (long)(pmVar6->elements).
                         super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pmVar6->elements).
                         super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3);
        pfVar1 = (pmVar6->elements).
                 super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_70 = (ulong)((long)(pmVar6->elements).
                                 super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)pfVar1) >> 3;
        if ((int)local_70 != 0) {
          pfVar2 = (local_48->linear_elements)._M_t.
                   super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                   super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl;
          piVar5 = &(local_68.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>.
                     _M_impl.super__Vector_impl_data._M_start)->id;
          uVar8 = 0;
          do {
            iVar11 = pfVar1[uVar8].variable_index;
            ((reduced_cost *)(piVar5 + -2))->value = pfVar2[iVar11];
            piVar5[-1] = pfVar1[uVar8].factor;
            *piVar5 = iVar11;
            uVar8 = uVar8 + 1;
            piVar5 = piVar5 + 3;
          } while ((local_70 & 0xffffffff) != uVar8);
        }
        std::
        shuffle<__gnu_cxx::__normal_iterator<baryonyx::itm::init_with_pre_solve<baryonyx::itm::default_cost_type<float>,baryonyx::itm::minimize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::default_cost_type<float>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::reduced_cost*,std::vector<baryonyx::itm::init_with_pre_solve<baryonyx::itm::default_cost_type<float>,baryonyx::itm::minimize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::default_cost_type<float>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::reduced_cost,std::allocator<baryonyx::itm::init_with_pre_solve<baryonyx::itm::default_cost_type<float>,baryonyx::itm::minimize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::default_cost_type<float>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::reduced_cost>>>,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                  ((__normal_iterator<reduced_cost_*,_std::vector<reduced_cost,_std::allocator<reduced_cost>_>_>
                    )local_68.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                   (__normal_iterator<reduced_cost_*,_std::vector<reduced_cost,_std::allocator<reduced_cost>_>_>
                    )local_68.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>.
                     _M_impl.super__Vector_impl_data._M_finish,local_50);
        prVar4 = local_68.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        prVar3 = local_68.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (local_68.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>._M_impl.
            super__Vector_impl_data._M_start !=
            local_68.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<baryonyx::itm::init_with_pre_solve<baryonyx::itm::default_cost_type<float>,baryonyx::itm::minimize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::default_cost_type<float>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::reduced_cost*,std::vector<baryonyx::itm::init_with_pre_solve<baryonyx::itm::default_cost_type<float>,baryonyx::itm::minimize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::default_cost_type<float>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::reduced_cost,std::allocator<baryonyx::itm::init_with_pre_solve<baryonyx::itm::default_cost_type<float>,baryonyx::itm::minimize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::default_cost_type<float>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::reduced_cost>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::init_with_pre_solve<baryonyx::itm::default_cost_type<float>,baryonyx::itm::minimize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::default_cost_type<float>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (local_68.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     local_68.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>.
                     _M_impl.super__Vector_impl_data._M_finish,
                     (int)LZCOUNT(((long)local_68.
                                         super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_68.
                                         super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 2) *
                                  -0x5555555555555555) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<__gnu_cxx::__normal_iterator<baryonyx::itm::init_with_pre_solve<baryonyx::itm::default_cost_type<float>,baryonyx::itm::minimize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::default_cost_type<float>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::reduced_cost*,std::vector<baryonyx::itm::init_with_pre_solve<baryonyx::itm::default_cost_type<float>,baryonyx::itm::minimize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::default_cost_type<float>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::reduced_cost,std::allocator<baryonyx::itm::init_with_pre_solve<baryonyx::itm::default_cost_type<float>,baryonyx::itm::minimize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::default_cost_type<float>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::reduced_cost>>>,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::init_with_pre_solve<baryonyx::itm::default_cost_type<float>,baryonyx::itm::minimize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::default_cost_type<float>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (prVar3,prVar4);
        }
        if ((x_pessimistic->super_bit_array_impl).m_data._M_t.
            super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
            super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
            super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl != (unsigned_long *)0x0) {
          iVar11 = -2;
          uVar10 = (uint)local_70;
          if (-1 < (int)uVar10) {
            piVar5 = &(local_68.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>.
                       _M_impl.super__Vector_impl_data._M_start)->factor;
            iVar9 = 0;
            uVar8 = 0xffffffffffffffff;
            do {
              if ((pmVar6->min <= iVar9) && (iVar9 <= pmVar6->max)) {
                iVar11 = (int)uVar8;
                break;
              }
              uVar8 = uVar8 + 1;
              if ((long)uVar8 < (long)(ulong)(uVar10 & 0x7fffffff)) {
                iVar9 = iVar9 + *piVar5;
              }
              piVar5 = piVar5 + 3;
            } while ((uVar10 & 0x7fffffff) != uVar8);
          }
          if (iVar11 < 0) {
            uVar8 = 0;
          }
          else {
            lVar14 = 8;
            uVar8 = 0;
            do {
              bit_array_impl::set(&x_pessimistic->super_bit_array_impl,
                                  *(int *)((long)&(local_68.
                                                  super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->value
                                          + lVar14));
              uVar8 = uVar8 + 1;
              lVar14 = lVar14 + 0xc;
            } while (iVar11 + 1 != uVar8);
            uVar10 = (uint)local_70;
          }
          if ((uint)uVar8 != uVar10) {
            lVar14 = (uVar8 & 0xffffffff) * 0xc + 8;
            lVar13 = (uVar8 & 0xffffffff) - (local_70 & 0xffffffff);
            do {
              bit_array_impl::unset
                        (&x_pessimistic->super_bit_array_impl,
                         *(int *)((long)&(local_68.
                                          super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->value + lVar14
                                 ));
              lVar14 = lVar14 + 0xc;
              lVar13 = lVar13 + 1;
            } while (lVar13 != 0);
          }
        }
        uVar10 = (uint)local_70;
        if ((x_optimistic->super_bit_array_impl).m_data._M_t.
            super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
            super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
            super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl != (unsigned_long *)0x0) {
          if ((int)uVar10 < 0) {
            iVar11 = -2;
          }
          else {
            uVar8 = (ulong)(uVar10 & 0x7fffffff);
            piVar5 = &(local_68.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>.
                       _M_impl.super__Vector_impl_data._M_start)->factor;
            iVar9 = 0;
            iVar11 = -2;
            uVar7 = 0xffffffffffffffff;
            do {
              iVar12 = (int)uVar7;
              if (pmVar6->max < iVar9) {
                iVar12 = iVar11;
              }
              if (iVar9 < pmVar6->min) {
                iVar12 = iVar11;
              }
              iVar11 = iVar12;
              if (((iVar11 != -2) && ((long)(uVar7 + 1) < (long)uVar8)) &&
                 (0.0 < ((reduced_cost *)(piVar5 + -1))->value)) break;
              uVar7 = uVar7 + 1;
              if ((long)uVar7 < (long)uVar8) {
                iVar9 = iVar9 + *piVar5;
              }
              piVar5 = piVar5 + 3;
            } while (uVar8 != uVar7);
          }
          if (iVar11 < 0) {
            uVar8 = 0;
          }
          else {
            lVar14 = 8;
            uVar8 = 0;
            do {
              bit_array_impl::set(&x_optimistic->super_bit_array_impl,
                                  *(int *)((long)&(local_68.
                                                  super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->value
                                          + lVar14));
              uVar8 = uVar8 + 1;
              lVar14 = lVar14 + 0xc;
            } while (iVar11 + 1 != uVar8);
            uVar10 = (uint)local_70;
          }
          if ((uint)uVar8 != uVar10) {
            lVar14 = (uVar8 & 0xffffffff) * 0xc + 8;
            lVar13 = (uVar8 & 0xffffffff) - (ulong)uVar10;
            do {
              bit_array_impl::unset
                        (&x_optimistic->super_bit_array_impl,
                         *(int *)((long)&(local_68.
                                          super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->value + lVar14
                                 ));
              lVar14 = lVar14 + 0xc;
              lVar13 = lVar13 + 1;
            } while (lVar13 != 0);
          }
        }
      }
      pmVar6 = pmVar6 + 1;
    } while (pmVar6 != local_40);
  }
  if (local_68.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>._M_impl.
      super__Vector_impl_data._M_start != (reduced_cost *)0x0) {
    operator_delete(local_68.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void
init_with_pre_solve(bit_array& x_pessimistic,
                    bit_array& x_optimistic,
                    random_engine& rng,
                    const Cost& c,
                    const std::vector<merged_constraint>& constraints,
                    const double init_random) noexcept
{
    int max_length = 0;
    for (const auto& cst : constraints)
        if (length(cst.elements) > max_length)
            max_length = length(cst.elements);

    struct reduced_cost
    {
        float value;
        int factor;
        int id;
    };

    std::vector<reduced_cost> R(max_length);
    std::bernoulli_distribution dist(init_random);

    for (const auto& cst : constraints) {
        if (!dist(rng))
            continue;

        R.resize(cst.elements.size());
        const int r_size = length(cst.elements);

        for (int i = 0; i != r_size; ++i) {
            R[i].value = static_cast<float>(c[cst.elements[i].variable_index]);
            R[i].factor = cst.elements[i].factor;
            R[i].id = cst.elements[i].variable_index;
        }

        std::shuffle(std::begin(R), std::end(R), rng);
        std::sort(
          std::begin(R), std::end(R), [](const auto& lhs, const auto& rhs) {
              return is_better_solution<Mode>(lhs.value, rhs.value);
          });

        if (!x_pessimistic.empty()) {
            int sum = 0;
            int best = -2;

            for (int i = -1; i < r_size; ++i) {
                if (cst.min <= sum && sum <= cst.max) {
                    best = i;
                    break;
                }

                if (i + 1 < r_size)
                    sum += R[i + 1].factor;
            }

            int i = 0;
            for (; i <= best; ++i)
                x_pessimistic.set(R[i].id);

            for (; i != r_size; ++i) {
                x_pessimistic.unset(R[i].id);
            }
        }

        if (!x_optimistic.empty()) {
            int sum = 0;
            int best = -2;

            for (int i = -1; i < r_size; ++i) {
                if (cst.min <= sum && sum <= cst.max)
                    best = i;

                if (best != -2 && i + 1 < r_size &&
                    stop_iterating<Mode>(R[i + 1].value))
                    break;

                if (i + 1 < r_size)
                    sum += R[i + 1].factor;
            }

            int i = 0;
            for (; i <= best; ++i)
                x_optimistic.set(R[i].id);

            for (; i != r_size; ++i)
                x_optimistic.unset(R[i].id);
        }
    }
}